

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O2

ZyanStatus
ZydisFormatterTokenizeInstruction
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count,void *buffer,ZyanUSize length,
          ZyanU64 runtime_address,ZydisFormatterTokenConst **token,void *user_data)

{
  ZyanStatus ZVar1;
  ZydisFormatterTokenConst *pZVar2;
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterTokenConst *local_b0;
  ZydisFormatterContext local_a8;
  ZydisFormatterBuffer local_80;
  
  ZVar1 = 0x80100004;
  if (instruction != (ZydisDecodedInstruction *)0x0 && formatter != (ZydisFormatter *)0x0) {
    if (((((operand_count < 0xb) &&
          (operands != (ZydisDecodedOperand *)0x0 || operand_count == '\0')) &&
         (token != (ZydisFormatterTokenConst **)0x0)) && ((2 < length && (buffer != (void *)0x0))))
       && (instruction->operand_count_visible <= operand_count)) {
      ZydisFormatterBufferInitTokenized(&local_80,&local_b0,buffer,length);
      local_a8.runtime_address = runtime_address;
      local_a8.operand = (ZydisDecodedOperand *)0x0;
      local_a8.user_data = user_data;
      local_a8.instruction = instruction;
      local_a8.operands = operands;
      if ((formatter->func_pre_instruction != (ZydisFormatterFunc)0x0) &&
         (ZVar1 = (*formatter->func_pre_instruction)(formatter,&local_80,&local_a8), (int)ZVar1 < 0)
         ) {
        return ZVar1;
      }
      ZVar1 = (*formatter->func_format_instruction)(formatter,&local_80,&local_a8);
      if (-1 < (int)ZVar1) {
        if ((formatter->func_post_instruction != (ZydisFormatterFunc)0x0) &&
           (ZVar1 = (*formatter->func_post_instruction)(formatter,&local_80,&local_a8),
           (int)ZVar1 < 0)) {
          return ZVar1;
        }
        pZVar2 = (ZydisFormatterTokenConst *)(&local_b0[1].type + local_b0->next);
        if ((ulong)local_b0->next == 0) {
          pZVar2 = local_b0;
        }
        *token = pZVar2;
        ZVar1 = 0x100000;
      }
    }
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterTokenizeInstruction(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operands,
    ZyanU8 operand_count, void* buffer, ZyanUSize length, ZyanU64 runtime_address,
    ZydisFormatterTokenConst** token, void* user_data)
{
    if (!formatter || !instruction || (operand_count && !operands) ||
        (operand_count > ZYDIS_MAX_OPERAND_COUNT) || 
        (operand_count < instruction->operand_count_visible) || !buffer ||
        (length <= sizeof(ZydisFormatterToken)) || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterToken* first_token;
    ZydisFormatterBufferInitTokenized(&formatter_buffer, &first_token, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = operands;
    context.runtime_address = runtime_address;
    context.operand         = ZYAN_NULL;
    context.user_data       = user_data;

    if (formatter->func_pre_instruction)
    {
        ZYAN_CHECK(formatter->func_pre_instruction(formatter, &formatter_buffer, &context));
    }

    ZYAN_CHECK(formatter->func_format_instruction(formatter, &formatter_buffer, &context));

    if (formatter->func_post_instruction)
    {
        ZYAN_CHECK(formatter->func_post_instruction(formatter, &formatter_buffer, &context));
    }

    if (first_token->next)
    {
        *token = (ZydisFormatterTokenConst*)((ZyanU8*)first_token + sizeof(ZydisFormatterToken) +
            first_token->next);
        return ZYAN_STATUS_SUCCESS;
    }

    *token = first_token;
    return ZYAN_STATUS_SUCCESS;
}